

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void UA_Session_init(UA_Session *session)

{
  *(undefined8 *)((long)&(session->clientDescription).discoveryUrlsSize + 1) = 0;
  *(undefined8 *)((long)&(session->clientDescription).discoveryUrls + 1) = 0;
  (session->clientDescription).discoveryProfileUri.data = (UA_Byte *)0x0;
  (session->clientDescription).discoveryUrlsSize = 0;
  (session->clientDescription).gatewayServerUri.data = (UA_Byte *)0x0;
  (session->clientDescription).discoveryProfileUri.length = 0;
  *(undefined8 *)&(session->clientDescription).applicationType = 0;
  (session->clientDescription).gatewayServerUri.length = 0;
  (session->clientDescription).applicationName.text.length = 0;
  (session->clientDescription).applicationName.text.data = (UA_Byte *)0x0;
  (session->clientDescription).applicationName.locale.length = 0;
  (session->clientDescription).applicationName.locale.data = (UA_Byte *)0x0;
  (session->clientDescription).productUri.length = 0;
  (session->clientDescription).productUri.data = (UA_Byte *)0x0;
  (session->clientDescription).applicationUri.length = 0;
  (session->clientDescription).applicationUri.data = (UA_Byte *)0x0;
  (session->sessionName).length = 0;
  (session->sessionName).data = (UA_Byte *)0x0;
  (session->authenticationToken).namespaceIndex = 0;
  *(undefined2 *)&(session->authenticationToken).field_0x2 = 0;
  (session->authenticationToken).identifierType = UA_NODEIDTYPE_NUMERIC;
  (session->authenticationToken).identifier.string.length = 0;
  (session->authenticationToken).identifier.string.data = (UA_Byte *)0x0;
  (session->sessionId).namespaceIndex = 0;
  *(undefined2 *)&(session->sessionId).field_0x2 = 0;
  (session->sessionId).identifierType = UA_NODEIDTYPE_NUMERIC;
  (session->sessionId).identifier.string.length = 0;
  (session->sessionId).identifier.string.data = (UA_Byte *)0x0;
  session->maxRequestMessageSize = 0;
  session->maxResponseMessageSize = 0;
  session->timeout = 0.0;
  session->validTill = 0;
  session->channel = (UA_SecureChannel *)0x0;
  session->availableContinuationPoints = 5;
  (session->continuationPoints).lh_first = (ContinuationPointEntry *)0x0;
  session->lastSubscriptionID = 0;
  (session->serverSubscriptions).lh_first = (UA_Subscription *)0x0;
  (session->responseQueue).sqh_first = (UA_PublishResponseEntry *)0x0;
  (session->responseQueue).sqh_last = &(session->responseQueue).sqh_first;
  return;
}

Assistant:

void UA_Session_init(UA_Session *session) {
    UA_ApplicationDescription_init(&session->clientDescription);
    session->activated = false;
    UA_NodeId_init(&session->authenticationToken);
    UA_NodeId_init(&session->sessionId);
    UA_String_init(&session->sessionName);
    session->maxRequestMessageSize  = 0;
    session->maxResponseMessageSize = 0;
    session->timeout = 0;
    UA_DateTime_init(&session->validTill);
    session->channel = NULL;
    session->availableContinuationPoints = UA_MAXCONTINUATIONPOINTS;
    LIST_INIT(&session->continuationPoints);
#ifdef UA_ENABLE_SUBSCRIPTIONS
    LIST_INIT(&session->serverSubscriptions);
    session->lastSubscriptionID = 0;
    SIMPLEQ_INIT(&session->responseQueue);
#endif
}